

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

shared_ptr<void> * __thiscall pstore::storage::segment_base(storage *this,segment_type segment)

{
  shared_ptr<void> *psVar1;
  segment_type segment_local;
  storage *this_local;
  
  psVar1 = segment_base_impl<pstore::storage,std::shared_ptr<void>const&>(this,segment);
  return psVar1;
}

Assistant:

std::shared_ptr<void> const & segment_base (address::segment_type const segment) noexcept {
            return segment_base_impl (*this, segment);
        }